

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

int __thiscall
helics::CommonCore::connect(CommonCore *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  string_view name;
  string_view string1;
  string_view str;
  bool bVar1;
  BrokerState BVar2;
  uint uVar3;
  GlobalBrokerId id;
  undefined6 extraout_var_01;
  pointer this_00;
  milliseconds to;
  CommonCore *this_01;
  string *file;
  long extraout_RAX;
  long lVar4;
  ulong uVar5;
  undefined7 extraout_var_00;
  ActionMessage reg;
  bool res;
  BrokerState cBrokerState;
  undefined4 in_stack_fffffffffffffe58;
  BrokerState in_stack_fffffffffffffe5c;
  BrokerState in_stack_fffffffffffffe5e;
  undefined6 in_stack_fffffffffffffe60;
  BrokerState in_stack_fffffffffffffe66;
  BrokerBase *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  basic_string_view<char,_std::char_traits<char>_> *this_02;
  undefined8 in_stack_fffffffffffffe78;
  action_t startingAction;
  ActionMessage *in_stack_fffffffffffffe80;
  int local_164;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffffea0;
  undefined8 local_150;
  GlobalFederateId local_130;
  undefined4 local_12c;
  __sv_type local_128;
  __sv_type local_118;
  __sv_type local_f8;
  GlobalFederateId local_e4;
  undefined1 local_e0 [8];
  GlobalFederateId local_d8;
  int8_t in_stack_ffffffffffffffbb;
  uint32_t in_stack_ffffffffffffffbc;
  BrokerBase *in_stack_ffffffffffffffc0;
  string_view in_stack_ffffffffffffffc8;
  GlobalFederateId in_stack_ffffffffffffffdc;
  byte bVar6;
  bool local_1;
  uint7 extraout_var;
  
  startingAction = (action_t)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x48b305);
  uVar5 = CONCAT62(extraout_var_01,BVar2);
  if (BVar2 == ERRORED) {
    local_1 = false;
  }
  else {
    if (CONFIGURING < BVar2) {
      bVar1 = BrokerBase::transitionBrokerState
                        ((BrokerBase *)CONCAT26(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)
                         ,in_stack_fffffffffffffe5e,in_stack_fffffffffffffe5c);
      if (bVar1) {
        this_00 = std::
                  unique_ptr<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>::
                  operator->((unique_ptr<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>
                              *)0x48b366);
        to = TimeRepresentation<count_time<9,_long>_>::to_ms
                       ((TimeRepresentation<count_time<9,_long>_> *)
                        CONCAT26(in_stack_fffffffffffffe5e,
                                 CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)));
        TimeoutMonitor::setTimeout(this_00,(milliseconds)to.__r);
        uVar3 = (*(this->super_Core)._vptr_Core[0x67])();
        bVar6 = (byte)uVar3 & 1;
        if ((uVar3 & 1) == 0) {
          BrokerBase::setBrokerState(in_stack_fffffffffffffe68,in_stack_fffffffffffffe66);
          lVar4 = (ulong)extraout_var << 8;
        }
        else {
          ActionMessage::ActionMessage(in_stack_fffffffffffffe80,startingAction);
          local_e4.gid = 0;
          GlobalFederateId::GlobalFederateId(&local_e4);
          local_d8.gid = local_e4.gid;
          this_01 = (CommonCore *)getIdentifier_abi_cxx11_(this);
          local_f8 = std::__cxx11::string::operator_cast_to_basic_string_view
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT26(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60));
          name._M_len._4_2_ = in_stack_fffffffffffffe5c;
          name._M_len._0_4_ = in_stack_fffffffffffffe58;
          name._M_len._6_2_ = in_stack_fffffffffffffe5e;
          name._M_str._0_6_ = in_stack_fffffffffffffe60;
          name._M_str._6_2_ = in_stack_fffffffffffffe66;
          ActionMessage::name((ActionMessage *)0x48b43c,name);
          file = getAddress_abi_cxx11_(this_01);
          local_118 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT26(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60));
          string1._M_str = in_stack_fffffffffffffe70;
          string1._M_len = (size_t)in_stack_fffffffffffffe68;
          ActionMessage::setStringData
                    ((ActionMessage *)CONCAT26(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60),
                     string1);
          bVar1 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x48b49d);
          if (!bVar1) {
            local_128 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT26(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60))
            ;
            str._M_str = (char *)this;
            str._M_len = (size_t)this_00;
            ActionMessage::setString((ActionMessage *)this_01,(int)((ulong)file >> 0x20),str);
          }
          setActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                    ((ActionMessage *)local_e0,core_flag);
          if (((this->super_BrokerBase).useJsonSerialization & 1U) != 0) {
            setActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                      ((ActionMessage *)local_e0,use_json_serialization_flag);
          }
          if (((this->super_BrokerBase).no_ping & 1U) != 0) {
            setActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                      ((ActionMessage *)local_e0,slow_responding_flag);
          }
          if (((this->super_BrokerBase).observer & 1U) != 0) {
            setActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                      ((ActionMessage *)local_e0,observer_flag);
          }
          local_12c = 0;
          (*(this->super_Core)._vptr_Core[0x6b])(this,0,local_e0);
          BrokerBase::setBrokerState(in_stack_fffffffffffffe68,in_stack_fffffffffffffe66);
          gmlc::concurrency::TriggerVariable::activate((TriggerVariable *)in_stack_fffffffffffffe68)
          ;
          bVar1 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x48b5f2);
          if (!bVar1) {
            makeConnections(this_01,file);
          }
          ActionMessage::~ActionMessage
                    ((ActionMessage *)CONCAT26(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60))
          ;
          lVar4 = extraout_RAX;
        }
        uVar5 = CONCAT71((int7)((ulong)lVar4 >> 8),bVar6) & 0xffffffffffffff01;
        local_1 = SUB81(uVar5,0);
        goto LAB_0048b728;
      }
      this_02 = (basic_string_view<char,_std::char_traits<char>_> *)&this->super_BrokerBase;
      id = CLI::std::atomic<helics::GlobalBrokerId>::load
                     (&(this->super_BrokerBase).global_id,seq_cst);
      GlobalFederateId::GlobalFederateId(&local_130,id);
      getIdentifier_abi_cxx11_(this);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT26(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60));
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (this_02,(char *)in_stack_fffffffffffffe68);
      in_stack_fffffffffffffe60 = (undefined6)local_150;
      in_stack_fffffffffffffe66 = (BrokerState)((ulong)local_150 >> 0x30);
      BrokerBase::sendToLogger
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffbc,
                 in_stack_ffffffffffffffc8,(string_view)reg._56_16_,(bool)in_stack_ffffffffffffffbb)
      ;
      while (BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x48b6ea), BVar2 == CONNECTING) {
        local_164 = 100;
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1000l>> *)&stack0xfffffffffffffea0,&local_164);
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_fffffffffffffea0);
      }
    }
    local_1 = isConnected((CommonCore *)
                          CONCAT26(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60));
    uVar5 = CONCAT71(extraout_var_00,local_1);
  }
LAB_0048b728:
  return (int)CONCAT71((int7)(uVar5 >> 8),local_1);
}

Assistant:

bool CommonCore::connect()
{
    auto cBrokerState = getBrokerState();
    if (cBrokerState == BrokerState::ERRORED) {
        return false;
    }
    if (cBrokerState >= BrokerState::CONFIGURED) {
        if (transitionBrokerState(BrokerState::CONFIGURED, BrokerState::CONNECTING)) {
            timeoutMon->setTimeout(timeout.to_ms());
            const bool res = brokerConnect();
            if (res) {
                // now register this core object as a broker

                ActionMessage reg(CMD_REG_BROKER);
                reg.source_id = GlobalFederateId{};
                reg.name(getIdentifier());
                reg.setStringData(getAddress());

                if (!brokerKey.empty()) {
                    reg.setString(1, brokerKey);
                }

                setActionFlag(reg, core_flag);
                if (useJsonSerialization) {
                    setActionFlag(reg, use_json_serialization_flag);
                }

                if (no_ping) {
                    setActionFlag(reg, slow_responding_flag);
                }
                if (observer) {
                    setActionFlag(reg, observer_flag);
                }
                transmit(parent_route_id, reg);
                setBrokerState(BrokerState::CONNECTED);
                disconnection.activate();
                if (!configString.empty()) {
                    makeConnections(configString);
                }
            } else {
                setBrokerState(BrokerState::CONFIGURED);
            }
            return res;
        }

        LOG_WARNING(global_id.load(), getIdentifier(), "multiple connect calls");
        while (getBrokerState() == BrokerState::CONNECTING) {
            std::this_thread::sleep_for(std::chrono::milliseconds(100));
        }
    }
    return isConnected();
}